

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Aggregate_State_PDU.cpp
# Opt level: O2

void __thiscall KDIS::PDU::Aggregate_State_PDU::Aggregate_State_PDU(Aggregate_State_PDU *this)

{
  Header7::Header7(&this->super_Header);
  (this->super_Header).super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Aggregate_State_PDU_00214898;
  DATA_TYPE::AggregateIdentifier::AggregateIdentifier(&this->m_AggregateID);
  this->m_ui8ForceID = '\0';
  this->m_ui8AggState = '\0';
  DATA_TYPE::AggregateType::AggregateType(&this->m_AggregateType);
  this->m_ui32Formation = 0;
  DATA_TYPE::AggregateMarking::AggregateMarking(&this->m_AggregateMarking);
  DATA_TYPE::Vector::Vector(&this->m_Dimensions);
  DATA_TYPE::EulerAngles::EulerAngles(&this->m_Ori);
  DATA_TYPE::WorldCoordinates::WorldCoordinates(&this->m_CtrOfMassLoc);
  DATA_TYPE::Vector::Vector(&this->m_Vel);
  this->m_ui16Padding1 = 0;
  this->m_ui16NumberOfPaddingOctets = 0;
  (this->m_vVD).
  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vVD).
  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vVD).
  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_ui16NumAggregates = 0;
  this->m_ui16NumEntities = 0;
  this->m_ui16NumSilentAggregateTypes = 0;
  this->m_ui16NumSilentEntityTypes = 0;
  (this->m_vAI).
  super__Vector_base<KDIS::DATA_TYPE::AggregateIdentifier,_std::allocator<KDIS::DATA_TYPE::AggregateIdentifier>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vAI).
  super__Vector_base<KDIS::DATA_TYPE::AggregateIdentifier,_std::allocator<KDIS::DATA_TYPE::AggregateIdentifier>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vAI).
  super__Vector_base<KDIS::DATA_TYPE::AggregateIdentifier,_std::allocator<KDIS::DATA_TYPE::AggregateIdentifier>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_vEI).
  super__Vector_base<KDIS::DATA_TYPE::EntityIdentifier,_std::allocator<KDIS::DATA_TYPE::EntityIdentifier>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vEI).
  super__Vector_base<KDIS::DATA_TYPE::EntityIdentifier,_std::allocator<KDIS::DATA_TYPE::EntityIdentifier>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->m_vEI).
           super__Vector_base<KDIS::DATA_TYPE::EntityIdentifier,_std::allocator<KDIS::DATA_TYPE::EntityIdentifier>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->m_vEI).
           super__Vector_base<KDIS::DATA_TYPE::EntityIdentifier,_std::allocator<KDIS::DATA_TYPE::EntityIdentifier>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (this->m_vSASL).
  super__Vector_base<KDIS::DATA_TYPE::SilentAggregateSystem,_std::allocator<KDIS::DATA_TYPE::SilentAggregateSystem>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vSASL).
  super__Vector_base<KDIS::DATA_TYPE::SilentAggregateSystem,_std::allocator<KDIS::DATA_TYPE::SilentAggregateSystem>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vSASL).
  super__Vector_base<KDIS::DATA_TYPE::SilentAggregateSystem,_std::allocator<KDIS::DATA_TYPE::SilentAggregateSystem>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_vSESL).
  super__Vector_base<KDIS::DATA_TYPE::SilentEntitySystem,_std::allocator<KDIS::DATA_TYPE::SilentEntitySystem>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  this->m_ui32NumVariableDatum = 0;
  (this->m_vSESL).
  super__Vector_base<KDIS::DATA_TYPE::SilentEntitySystem,_std::allocator<KDIS::DATA_TYPE::SilentEntitySystem>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vSESL).
  super__Vector_base<KDIS::DATA_TYPE::SilentEntitySystem,_std::allocator<KDIS::DATA_TYPE::SilentEntitySystem>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Header).super_Header6.m_ui8PDUType = '!';
  (this->super_Header).super_Header6.m_ui8ProtocolFamily = '\a';
  (this->super_Header).super_Header6.m_ui16PDULength = 0x88;
  (this->super_Header).super_Header6.m_ui8ProtocolVersion = '\x06';
  return;
}

Assistant:

Aggregate_State_PDU::Aggregate_State_PDU() :
    m_ui8ForceID( 0 ),
    m_ui8AggState( 0 ),
    m_ui32Formation( 0 ),
    m_ui16NumAggregates( 0 ),
    m_ui16NumEntities( 0 ),
    m_ui16NumSilentAggregateTypes( 0 ),
    m_ui16NumSilentEntityTypes( 0 ),
    m_bNeedsPadding( false ),
    m_ui16Padding1( 0 ),
    m_ui16NumberOfPaddingOctets( 0 ),
    m_ui32NumVariableDatum( 0 )
{
    m_ui8ProtocolFamily = EntityManagement;
    m_ui8PDUType = AggregateState_PDU_Type;
    m_ui16PDULength = AGGREGATE_STATE_PDU_SIZE;
    m_ui8ProtocolVersion = IEEE_1278_1A_1998;
}